

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csg_parser.cpp
# Opt level: O2

object * __thiscall ocmesh::details::parser::parse_primitive(parser *this)

{
  uint64_t uVar1;
  object *poVar2;
  string name;
  undefined1 local_98 [48];
  undefined1 local_68 [40];
  float local_40;
  undefined1 local_38 [48];
  
  if ((this->_current)._kind == primitive) {
    std::__cxx11::string::string((string *)&name,&(this->_current)._text);
    lex<ocmesh::details::token::kind_t,_void,_0>((token *)local_38,this,lparen);
    std::__cxx11::string::~string((string *)(local_38 + 8));
    lex<ocmesh::details::token::kind_t,_void,_0>((token *)local_68,this,number);
    std::__cxx11::string::~string((string *)(local_68 + 8));
    lex<ocmesh::details::token::kind_t,_void,_0>((token *)local_98,this,rparen);
    std::__cxx11::string::~string((string *)(local_98 + 8));
    uVar1 = utils::details::hash(name._M_dataplus._M_p,name._M_string_length);
    if (uVar1 == 0x4c5f6190acb3dc80) {
      poVar2 = scene::cube(this->_scene,local_40);
    }
    else {
      poVar2 = scene::sphere(this->_scene,local_40);
    }
    std::__cxx11::string::~string((string *)&name);
    return poVar2;
  }
  __assert_fail("_current.is(token::primitive)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/nicola-gigante[P]ocmesh/src/csg_parser.cpp"
                ,0x122,"object *ocmesh::details::parser::parse_primitive()");
}

Assistant:

bool is(kind_t k) const {
            return _kind == k;
        }